

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

ParseDescriptorRequestStruct * __thiscall
cfd::js::api::json::ParseDescriptorRequest::ConvertToStruct
          (ParseDescriptorRequestStruct *__return_storage_ptr__,ParseDescriptorRequest *this)

{
  ParseDescriptorRequest *this_local;
  ParseDescriptorRequestStruct *result;
  
  ParseDescriptorRequestStruct::ParseDescriptorRequestStruct(__return_storage_ptr__);
  __return_storage_ptr__->is_elements = (bool)(this->is_elements_ & 1);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->descriptor,(string *)&this->descriptor_);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->network,(string *)&this->network_);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->bip32_derivation_path,
             (string *)&this->bip32_derivation_path_);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&__return_storage_ptr__->ignore_items,&this->ignore_items);
  return __return_storage_ptr__;
}

Assistant:

ParseDescriptorRequestStruct ParseDescriptorRequest::ConvertToStruct() const {  // NOLINT
  ParseDescriptorRequestStruct result;
  result.is_elements = is_elements_;
  result.descriptor = descriptor_;
  result.network = network_;
  result.bip32_derivation_path = bip32_derivation_path_;
  result.ignore_items = ignore_items;
  return result;
}